

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O1

idx_t __thiscall duckdb::CSVFileHandle::Read(CSVFileHandle *this,void *buffer,idx_t nr_bytes)

{
  int iVar1;
  type file_handle_input;
  idx_t iVar2;
  pointer this_00;
  
  this->requested_bytes = this->requested_bytes + nr_bytes;
  iVar1 = ::std::__cxx11::string::compare((char *)&this->encoder);
  if (iVar1 == 0) {
    this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->(&this->file_handle);
    iVar2 = FileHandle::Read(this_00,buffer,nr_bytes);
  }
  else {
    file_handle_input =
         unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                   (&this->file_handle);
    iVar2 = CSVEncoder::Encode(&this->encoder,file_handle_input,(char *)buffer,nr_bytes);
  }
  if (this->finished == false) {
    this->finished = iVar2 == 0;
  }
  this->uncompressed_bytes_read = this->uncompressed_bytes_read + iVar2;
  return iVar2;
}

Assistant:

idx_t CSVFileHandle::Read(void *buffer, idx_t nr_bytes) {
	requested_bytes += nr_bytes;
	// if this is a plain file source OR we can seek we are not caching anything
	idx_t bytes_read = 0;
	if (encoder.encoding_name == "utf-8") {
		bytes_read = static_cast<idx_t>(file_handle->Read(buffer, nr_bytes));
	} else {
		bytes_read = encoder.Encode(*file_handle, static_cast<char *>(buffer), nr_bytes);
	}
	if (!finished) {
		finished = bytes_read == 0;
	}
	uncompressed_bytes_read += static_cast<idx_t>(bytes_read);
	return UnsafeNumericCast<idx_t>(bytes_read);
}